

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

char * get_reg_var_name(c2m_ctx_t c2m_ctx,MIR_type_t promoted_type,char *suffix,uint func_scope_num)

{
  MIR_type_t MVar1;
  VARR_char *pVVar2;
  uint n;
  char *pcVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  MIR_type_t *types;
  int iVar5;
  int *extraout_RDX;
  char *type;
  c2m_ctx_t c2m_ctx_00;
  ulong uVar6;
  str_t sVar7;
  char prefix [50];
  
  types = (MIR_type_t *)CONCAT44(in_register_0000000c,func_scope_num);
  c2m_ctx_00 = (c2m_ctx_t)&stack0xffffffffffffffb8;
  if (promoted_type - MIR_T_I32 < 5) {
    type = &DAT_001bca50 + *(int *)(&DAT_001bca50 + (ulong)(promoted_type - MIR_T_I32) * 4);
  }
  else {
    type = "D%u_";
    if (promoted_type == MIR_T_D) {
      type = "d%u_";
    }
  }
  sprintf(&stack0xffffffffffffffb8,type,(ulong)func_scope_num);
  pVVar2 = c2m_ctx->temp_string;
  if ((pVVar2 == (VARR_char *)0x0) || (pVVar2->varr == (char *)0x0)) {
    get_reg_var_name_cold_2();
  }
  else {
    pVVar2->els_num = 0;
    add_to_temp_string(c2m_ctx,&stack0xffffffffffffffb8);
    c2m_ctx_00 = c2m_ctx;
    add_to_temp_string(c2m_ctx,suffix);
    type = suffix;
    if (c2m_ctx->temp_string != (VARR_char *)0x0) {
      sVar7 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
      return sVar7.s;
    }
  }
  get_reg_var_name_cold_1();
  n = classify_arg(c2m_ctx_00,(type *)type,types,(int)types);
  pcVar3 = (char *)0x0;
  if ((n != 0) && ((((type *)type)->mode & ~TM_BASIC) == TM_STRUCT)) {
    update_last_qword_type(c2m_ctx_00,(type *)type,types,n);
    iVar5 = 0;
    iVar4 = 0;
    if (0 < (int)n) {
      uVar6 = 0;
      iVar4 = 0;
      iVar5 = 0;
      do {
        MVar1 = types[uVar6];
        if (0x15 < MVar1) {
LAB_0019b07e:
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                        ,0x141,
                        "int process_aggregate_arg(c2m_ctx_t, struct type *, target_arg_info_t *, MIR_type_t *)"
                       );
        }
        if ((0x55U >> (MVar1 & 0x1f) & 1) == 0) {
          if ((0x300U >> (MVar1 & 0x1f) & 1) == 0) {
            if ((0x200400U >> (MVar1 & 0x1f) & 1) != 0) {
              return (char *)0x0;
            }
            goto LAB_0019b07e;
          }
          iVar4 = iVar4 + 1;
        }
        else {
          iVar5 = iVar5 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (n != uVar6);
    }
    pcVar3 = (char *)0x0;
    if ((iVar5 + *extraout_RDX < 7) && (pcVar3 = (char *)0x0, iVar4 + extraout_RDX[1] < 9)) {
      *extraout_RDX = iVar5 + *extraout_RDX;
      extraout_RDX[1] = iVar4 + extraout_RDX[1];
      pcVar3 = (char *)(ulong)n;
    }
  }
  return pcVar3;
}

Assistant:

static const char *get_reg_var_name (c2m_ctx_t c2m_ctx, MIR_type_t promoted_type,
                                     const char *suffix, unsigned func_scope_num) {
  char prefix[50];

  sprintf (prefix,
           promoted_type == MIR_T_I64   ? "I%u_"
           : promoted_type == MIR_T_U64 ? "U%u_"
           : promoted_type == MIR_T_I32 ? "i%u_"
           : promoted_type == MIR_T_U32 ? "u%u_"
           : promoted_type == MIR_T_F   ? "f%u_"
           : promoted_type == MIR_T_D   ? "d%u_"
                                        : "D%u_",
           func_scope_num);
  VARR_TRUNC (char, temp_string, 0);
  add_to_temp_string (c2m_ctx, prefix);
  add_to_temp_string (c2m_ctx, suffix);
  return uniq_cstr (c2m_ctx, VARR_ADDR (char, temp_string)).s;
}